

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

NodeAndBucket __thiscall
google::protobuf::internal::KeyMapBase<bool>::FindHelper(KeyMapBase<bool> *this,ViewType k)

{
  bool bVar1;
  map_index_t mVar2;
  NodeAndBucket NVar3;
  KeyMapBase<bool> *local_30;
  NodeBase *node;
  map_index_t b;
  ViewType k_local;
  KeyMapBase<bool> *this_local;
  
  AssertLoadFactor(this);
  mVar2 = BucketNumber(this,k);
  local_30 = (KeyMapBase<bool> *)(this->super_UntypedMapBase).table_[mVar2];
  do {
    if (local_30 == (KeyMapBase<bool> *)0x0) {
      this_local = (KeyMapBase<bool> *)0x0;
LAB_007d17f4:
      NVar3.bucket = mVar2;
      NVar3.node = (NodeBase *)this_local;
      NVar3._12_4_ = 0;
      return NVar3;
    }
    bVar1 = KeyNode<bool>::key((KeyNode<bool> *)local_30);
    bVar1 = TransparentSupport<bool>::ToView(bVar1);
    if (bVar1 == k) {
      this_local = local_30;
      goto LAB_007d17f4;
    }
    local_30 = *(KeyMapBase<bool> **)&local_30->super_UntypedMapBase;
  } while( true );
}

Assistant:

NodeAndBucket FindHelper(typename TS::ViewType k) const {
    AssertLoadFactor();
    map_index_t b = BucketNumber(k);
    for (auto* node = table_[b]; node != nullptr; node = node->next) {
      if (TS::ToView(static_cast<KeyNode*>(node)->key()) == k) {
        return {node, b};
      }
    }
    return {nullptr, b};
  }